

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall JetHead::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  socklen_t __len_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  undefined4 in_register_0000000c;
  int iVar6;
  undefined4 in_register_00000034;
  sockaddr *__addr_00;
  int ret;
  socklen_t len;
  timeval t;
  fd_set fd_w;
  int local_c0 [2];
  timeval local_b8;
  fd_set local_a8;
  
  __addr_00 = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  local_c0[1] = 0;
  __len_00._0_2_ = __addr_00[1].sa_family;
  __len_00._2_1_ = __addr_00[1].sa_data[0];
  __len_00._3_1_ = __addr_00[1].sa_data[1];
  local_b8.tv_sec = (__time_t)(int)__addr;
  local_b8.tv_usec = 0;
  uVar1 = fcntl(this->mFd,3,0,CONCAT44(in_register_0000000c,__len));
  iVar6 = -1;
  if ((-1 < (int)uVar1) && (iVar2 = fcntl(this->mFd,4,(ulong)(uVar1 | 0x800)), -1 < iVar2)) {
    iVar3 = ::connect(this->mFd,__addr_00,__len_00);
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    iVar4 = fcntl(this->mFd,4,(ulong)uVar1);
    if ((-1 < iVar4) && ((-1 < iVar3 || (iVar2 == 0x73)))) {
      local_a8.fds_bits[0xe] = 0;
      local_a8.fds_bits[0xf] = 0;
      local_a8.fds_bits[0xc] = 0;
      local_a8.fds_bits[0xd] = 0;
      local_a8.fds_bits[10] = 0;
      local_a8.fds_bits[0xb] = 0;
      local_a8.fds_bits[8] = 0;
      local_a8.fds_bits[9] = 0;
      local_a8.fds_bits[6] = 0;
      local_a8.fds_bits[7] = 0;
      local_a8.fds_bits[4] = 0;
      local_a8.fds_bits[5] = 0;
      local_a8.fds_bits[2] = 0;
      local_a8.fds_bits[3] = 0;
      local_a8.fds_bits[0] = 0;
      local_a8.fds_bits[1] = 0;
      iVar2 = this->mFd;
      iVar3 = iVar2 + 0x3f;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      local_a8.fds_bits[iVar3 >> 6] =
           local_a8.fds_bits[iVar3 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
      iVar2 = select(0x400,(fd_set *)0x0,&local_a8,(fd_set *)0x0,&local_b8);
      if (0 < iVar2) {
        local_c0[1] = 4;
        iVar2 = getsockopt(this->mFd,1,4,local_c0,(socklen_t *)(local_c0 + 1));
        if (((-1 < iVar2) && (local_c0[0] == 0)) && (iVar6 = iVar2, iVar2 == 0)) {
          setConnected(this,true,1);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int Socket::connect( const Socket::Address &addr, int timeout )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	socklen_t len = 0;
	int len_addr = 0;
	int res = 0;
	int saveflags, ret, back_err;
	const struct sockaddr *saddr = addr.getAddr( len_addr );
	fd_set fd_w;
	struct timeval t;

	t.tv_sec = timeout;
	t.tv_usec = 0;

	saveflags=fcntl(mFd,F_GETFL,0);

	if( saveflags < 0 ) {
		return -1;
	}

	/* Set non blocking */
	if(fcntl(mFd,F_SETFL,saveflags|O_NONBLOCK)<0) {
		return -1;
	}

	/* This will return immediately */
	res = ::connect( mFd, saddr, len_addr );
	back_err=errno;

	/* restore flags */
	if(fcntl(mFd,F_SETFL,saveflags)<0) {
		return -1;
	}

	/* return unless the connection was successful or the connect is
	still in progress. */
	if(res<0 && back_err!=EINPROGRESS) {
		return -1;
	}

	FD_ZERO(&fd_w);
	FD_SET(mFd,&fd_w);

	res=select(FD_SETSIZE,NULL,&fd_w,NULL,&t);

	if(res < 0) {
		return -1;
	}

	/* 0 means it timeout out & no fds changed */
	if( res == 0 ) {
		return -1;
	}

	/* Get the return code from the connect */
	len=sizeof(ret);
	res=getsockopt(mFd,SOL_SOCKET,SO_ERROR,&ret,&len);
	if(res<0) {
		return -1;
	}

	/* ret=0 means success, otherwise it contains the errno */
	if(ret) {
		return -1;
	}

	LOG_NOTICE( "connect to %s on port %d", addr.getName(), addr.getPort() );

	if ( res == 0 )
		setConnected( true );

	return res;
}